

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O3

StringTree * __thiscall
kj::strTree<float,char_const(&)[6],double,char_const(&)[6],int>
          (StringTree *__return_storage_ptr__,kj *this,float *params,char (*params_1) [6],
          double *params_2,char (*params_3) [6],int *params_4)

{
  undefined1 local_b0 [16];
  undefined1 local_a0 [16];
  StringTree local_90;
  CappedArray<char,_32UL> local_58;
  
  _::Stringifier::operator*
            ((CappedArray<char,_24UL> *)(local_a0 + 0x10),(Stringifier *)&_::STR,*(float *)this);
  local_a0._8_8_ = strlen((char *)params);
  local_a0._0_8_ = params;
  _::Stringifier::operator*(&local_58,(Stringifier *)&_::STR,*(double *)params_1);
  local_b0._8_8_ = strlen((char *)params_2);
  local_b0._0_8_ = params_2;
  _::Stringifier::operator*
            ((CappedArray<char,_14UL> *)&local_90.branches,(Stringifier *)&_::STR,
             (int)((CappedArray<char,_14UL> *)params_3)->currentSize);
  StringTree::
  concat<kj::CappedArray<char,24ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,32ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>>
            (__return_storage_ptr__,(StringTree *)(local_a0 + 0x10),
             (CappedArray<char,_24UL> *)local_a0,(ArrayPtr<const_char> *)&local_58,
             (CappedArray<char,_32UL> *)local_b0,(ArrayPtr<const_char> *)&local_90.branches,
             (CappedArray<char,_14UL> *)params_3);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}